

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_boost::python::str,_boost::python::str,_boost::python::list_&>_>
::operator()(impl<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_boost::python::str,_boost::python::str,_boost::python::list_&>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  first_reference pfVar2;
  PyObject *result;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_ffffffffffffff48;
  arg_from_python<boost::python::list_&> *in_stack_ffffffffffffff50;
  int local_88 [2];
  PyObject *local_80;
  undefined4 local_78;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  arg_lvalue_from_python_base local_30;
  _object *local_28 [2];
  _object *local_18 [2];
  PyObject *local_8;
  
  get<0>(local_28);
  arg_from_python<PythonModuleClient_&>::arg_from_python
            ((arg_from_python<PythonModuleClient_&> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  bVar1 = converter::arg_lvalue_from_python_base::convertible(&local_30);
  if (bVar1) {
    get<1>(local_28);
    arg_from_python<boost::python::str>::arg_from_python
              ((arg_from_python<boost::python::str> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    bVar1 = converter::object_manager_value_arg_from_python<boost::python::str>::convertible
                      ((object_manager_value_arg_from_python<boost::python::str> *)0x3f3abf);
    if (bVar1) {
      get<2>(local_28);
      arg_from_python<boost::python::str>::arg_from_python
                ((arg_from_python<boost::python::str> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
      bVar1 = converter::object_manager_value_arg_from_python<boost::python::str>::convertible
                        ((object_manager_value_arg_from_python<boost::python::str> *)0x3f3af8);
      if (bVar1) {
        get<3>(local_28);
        arg_from_python<boost::python::list_&>::arg_from_python
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        bVar1 = converter::object_manager_ref_arg_from_python<boost::python::list_&>::convertible
                          ((object_manager_ref_arg_from_python<boost::python::list_&> *)0x3f3b36);
        if (bVar1) {
          compressed_pair<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies>
          ::second((compressed_pair<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies>
                    *)0x3f3b86);
          bVar1 = default_call_policies::precall<_object*>(local_28);
          if (bVar1) {
            local_88[0] = create_result_converter<_object*,int>(local_18,(int *)0x0);
            pfVar2 = compressed_pair<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies>
                     ::first((compressed_pair<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies>
                              *)0x3f3bd4);
            local_80 = invoke<int,void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<boost::python::str>,boost::python::arg_from_python<boost::python::str>,boost::python::arg_from_python<boost::python::list&>>
                                 (local_88,pfVar2,&local_30,local_40,local_50,local_60);
            compressed_pair<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies>
            ::second((compressed_pair<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies>
                      *)0x3f3c1c);
            local_8 = default_call_policies::postcall<_object*>(local_28,local_80);
          }
          else {
            local_8 = (PyObject *)0x0;
          }
        }
        else {
          local_8 = (PyObject *)0x0;
        }
        local_78 = 1;
        arg_from_python<boost::python::list_&>::~arg_from_python
                  ((arg_from_python<boost::python::list_&> *)0x3f3c4a);
      }
      else {
        local_8 = (PyObject *)0x0;
      }
    }
    else {
      local_8 = (PyObject *)0x0;
    }
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }